

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateDefaultInstanceInitializer
          (MessageGenerator *this,Printer *printer)

{
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *psVar1;
  Descriptor *pDVar2;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar3;
  char *__function;
  long lVar4;
  
  io::Printer::Print(printer,"$classname$::default_instance_->InitAsDefaultInstance();\n",
                     "classname",&this->classname_);
  pDVar2 = this->descriptor_;
  if (0 < *(int *)(pDVar2 + 0x68)) {
    lVar4 = 0;
    do {
      psVar1 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
               ::operator[](&this->extension_generators_,lVar4);
      if (psVar1->ptr_ == (ExtensionGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::operator->() const [C = google::protobuf::compiler::cpp::ExtensionGenerator]"
        ;
        goto LAB_0019498d;
      }
      ExtensionGenerator::GenerateRegistration(psVar1->ptr_,printer);
      lVar4 = lVar4 + 1;
      pDVar2 = this->descriptor_;
    } while (lVar4 < *(int *)(pDVar2 + 0x68));
  }
  if (0 < *(int *)(pDVar2 + 0x38)) {
    lVar4 = 0;
    do {
      psVar3 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->nested_generators_,lVar4);
      if (psVar3->ptr_ == (MessageGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cpp::MessageGenerator]"
        ;
LAB_0019498d:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,__function);
      }
      GenerateDefaultInstanceInitializer(psVar3->ptr_,printer);
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(int *)(this->descriptor_ + 0x38));
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateDefaultInstanceInitializer(io::Printer* printer) {
  printer->Print(
    "$classname$::default_instance_->InitAsDefaultInstance();\n",
    "classname", classname_);

  // Register extensions.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators_[i]->GenerateRegistration(printer);
  }

  // Handle nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateDefaultInstanceInitializer(printer);
  }
}